

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::value_true(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_d0;
  value local_cc;
  undefined1 local_c5;
  undefined1 local_c4 [2];
  undefined1 local_c2;
  undefined1 local_c1 [2];
  undefined1 local_bf;
  undefined1 local_be [2];
  undefined4 local_bc;
  value local_b8 [2];
  undefined4 local_b0;
  value local_ac [6];
  undefined4 local_94;
  value local_90 [2];
  undefined1 local_88 [8];
  reader reader;
  value_type input [1];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0x81;
  trial::protocol::bintoken::reader::reader<unsigned_char[1]>
            ((reader *)local_88,
             (uchar (*) [1])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x1f));
  local_90[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_94 = 0x81;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x74,"void basic_suite::value_true()",local_90,&local_94);
  local_ac[0] = trial::protocol::bintoken::reader::symbol((reader *)local_88);
  local_b0 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x75,"void basic_suite::value_true()",local_ac,&local_b0);
  local_b8[0] = trial::protocol::bintoken::reader::category((reader *)local_88);
  local_bc = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x76,"void basic_suite::value_true()",local_b8,&local_bc);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x77,"void basic_suite::value_true()",sVar1 == 1);
  local_be[0] = trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::boolean>
                          ((reader *)local_88);
  local_bf = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<token::boolean>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x78,"void basic_suite::value_true()",local_be,&local_bf);
  local_c1[0] = trial::protocol::bintoken::reader::value<bool>((reader *)local_88);
  local_c2 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x79,"void basic_suite::value_true()",local_c1,&local_c2);
  local_c4[0] = trial::protocol::bintoken::reader::next((reader *)local_88);
  local_c5 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x7a,"void basic_suite::value_true()",local_c4,&local_c5);
  local_cc = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_d0 = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x7b,"void basic_suite::value_true()",&local_cc,&local_d0);
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void value_true()
{
    const value_type input[] = { token::code::true_value };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::boolean>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}